

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O0

int __thiscall helics::Input::getValue(Input *this,char *str,int maxsize)

{
  void *__dest;
  size_type sVar1;
  int *piVar2;
  char *__src;
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  int length;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *S;
  Input *in_stack_000000c0;
  int local_28;
  int local_24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  int local_14;
  void *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_20 = getValueRef<std::__cxx11::string>(in_stack_000000c0);
  local_24 = 0;
  if ((local_10 != (void *)0x0) && (0 < local_14)) {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (local_20);
    local_28 = (int)sVar1;
    piVar2 = std::min<int>(&local_28,&local_14);
    __dest = local_10;
    local_24 = *piVar2;
    __src = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3c45bb
                      );
    memcpy(__dest,__src,(long)local_24);
    if (local_24 == local_14) {
      *(undefined1 *)((long)local_10 + (long)(local_14 + -1)) = 0;
    }
    else {
      *(undefined1 *)((long)local_10 + (long)local_24) = 0;
      local_24 = local_24 + 1;
    }
  }
  *(undefined1 *)(in_RDI + 0x59) = 0;
  return local_24;
}

Assistant:

int Input::getValue(char* str, int maxsize)
{
    const auto& S = getValueRef<std::string>();
    int length = 0;
    if (str != nullptr && maxsize > 0) {
        length = std::min(static_cast<int>(S.size()), maxsize);
        memcpy(str, S.data(), length);
        if (length == maxsize) {
            str[maxsize - 1] = '\0';
        } else {
            str[length] = '\0';
            ++length;
        }
    }
    hasUpdate = false;
    return length;
}